

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O0

void __thiscall
mp::SolverOptionManager::AddIntOption<mp::BasicSolver,int>
          (SolverOptionManager *this,char *name,char *description,Get get,
          offset_in_BasicSolver_to_subr set)

{
  ValueArrayRef values;
  void *get_00;
  char *in_RCX;
  SolverOptionManager *in_RDX;
  OptionPtr *in_R8;
  ConcreteOption<mp::BasicSolver,_long_long,_int> *in_stack_00000008;
  unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_> *in_stack_00000010;
  ConcreteOption<mp::BasicSolver,_long_long,_int> *this_00;
  SolverOptionManager *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  ValueArrayRef local_60;
  ConcreteOption<mp::BasicSolver,_long_long,_int> *local_48;
  unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_> *local_40;
  char *local_38;
  OptionPtr *local_30;
  SolverOptionManager *local_28;
  
  local_40 = in_stack_00000010;
  local_48 = in_stack_00000008;
  local_38 = in_RCX;
  local_30 = in_R8;
  local_28 = in_RDX;
  get_00 = operator_new(0xf8);
  this_00 = local_48;
  ValueArrayRef::ValueArrayRef(&local_60);
  values._8_8_ = in_stack_ffffffffffffff98;
  values.values_ = (OptionValueInfo *)in_stack_ffffffffffffff90;
  ConcreteOption<mp::BasicSolver,_long_long,_int>::ConcreteOption<mp::SolverOptionManager>
            (this_00,(char *)local_30,local_38,local_28,(Get)get_00,(Set)in_RDX,values);
  std::unique_ptr<mp::SolverOption,std::default_delete<mp::SolverOption>>::
  unique_ptr<std::default_delete<mp::SolverOption>,void>(local_40,(pointer)this_00);
  AddOption(in_stack_ffffffffffffff90,local_30);
  std::unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_>::~unique_ptr(local_40);
  return;
}

Assistant:

void AddIntOption(const char *name,
                    const char *description, Int (Handler::*get)(const SolverOption &) const,
                    void (Handler::*set)(const SolverOption &, Int)) {
    AddOption(OptionPtr(new ConcreteOption<Handler, fmt::LongLong, Int>(
                          name, description, this, get, set)));
  }